

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol_tests.cpp
# Opt level: O2

void torcontrol_tests::CheckParseTorReplyMapping
               (string *input,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *expected)

{
  long lVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  _Rb_tree_node_base *p_Var5;
  _Self __tmp_1;
  _Self __tmp;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string file;
  const_string file_00;
  const_string file_01;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  size_t local_c8;
  _Rb_tree_node_base local_c0;
  undefined1 local_a0;
  undefined1 *local_98;
  char *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ret;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ParseTorReplyMapping(&ret,input);
  local_78 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/torcontrol_tests.cpp"
  ;
  local_70 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x3e;
  file.m_begin = (iterator)&local_78;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_88,msg);
  local_a0 = 0;
  local_c0._M_right = (_Base_ptr)&PTR__lazy_ostream_01139f30;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = "";
  local_c0._M_parent = (_Base_ptr)0xc3df29;
  local_c0._M_left = (_Base_ptr)0xc3df92;
  p_Var5 = &local_c0;
  local_c0._0_8_ = ret._M_t._M_impl.super__Rb_tree_header._M_node_count;
  local_c8 = (expected->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&local_c0._M_right,&local_c0._M_parent,0x3e,1,2,p_Var5,"ret.size()",&local_c8,
             "expected.size()");
  p_Var2 = ret._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var3 = (expected->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      ((_Rb_tree_header *)p_Var2 != &ret._M_t._M_impl.super__Rb_tree_header &&
      ((_Rb_tree_header *)p_Var3 != &(expected->_M_t)._M_impl.super__Rb_tree_header));
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    local_d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/torcontrol_tests.cpp"
    ;
    local_d0 = "";
    local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = (iterator)p_Var5;
    msg_00.m_begin = pvVar4;
    file_00.m_end = (iterator)0x42;
    file_00.m_begin = (iterator)&local_d8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_e8,
               msg_00);
    local_a0 = 0;
    local_c0._M_right = (_Base_ptr)&PTR__lazy_ostream_01139f30;
    local_98 = boost::unit_test::lazy_ostream::inst;
    local_90 = "";
    local_f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/torcontrol_tests.cpp"
    ;
    local_f0 = "";
    p_Var5 = p_Var2 + 1;
    pvVar4 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&local_c0._M_right,&local_f8,0x42,1,2,p_Var5,"r_it->first",p_Var3 + 1,"e_it->first");
    local_108 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/torcontrol_tests.cpp"
    ;
    local_100 = "";
    local_118 = &boost::unit_test::basic_cstring<char_const>::null;
    local_110 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_01.m_end = (iterator)p_Var5;
    msg_01.m_begin = pvVar4;
    file_01.m_end = (iterator)0x43;
    file_01.m_begin = (iterator)&local_108;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_118,
               msg_01);
    local_a0 = 0;
    local_c0._M_right = (_Base_ptr)&PTR__lazy_ostream_01139f30;
    local_98 = boost::unit_test::lazy_ostream::inst;
    local_90 = "";
    local_128 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/torcontrol_tests.cpp"
    ;
    local_120 = "";
    p_Var5 = p_Var2 + 2;
    pvVar4 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&local_c0._M_right,&local_128,0x43,1,2,p_Var5,"r_it->second",p_Var3 + 2,
               "e_it->second");
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&ret._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CheckParseTorReplyMapping(std::string input, std::map<std::string,std::string> expected)
{
    auto ret = ParseTorReplyMapping(input);
    BOOST_CHECK_EQUAL(ret.size(), expected.size());
    auto r_it = ret.begin();
    auto e_it = expected.begin();
    while (r_it != ret.end() && e_it != expected.end()) {
        BOOST_CHECK_EQUAL(r_it->first, e_it->first);
        BOOST_CHECK_EQUAL(r_it->second, e_it->second);
        r_it++;
        e_it++;
    }
}